

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_manager.cpp
# Opt level: O2

void __thiscall
pcplusplus::thread_manager::run_threads
          (thread_manager *this,size_t num_producers,size_t num_consumers,size_t buffer_capacity,
          size_t target)

{
  bool bVar1;
  queue<long> *this_00;
  producer_threads *this_01;
  consumer_threads *this_02;
  ostream *poVar2;
  condition_variable canConsume;
  condition_variable canProduce;
  mutex mtx;
  
  this_00 = (queue<long> *)operator_new(0x28);
  queue<long>::queue(this_00,buffer_capacity);
  mtx.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mtx.super___mutex_base._M_mutex.__align = 0;
  mtx.super___mutex_base._M_mutex._8_8_ = 0;
  mtx.super___mutex_base._M_mutex._16_8_ = 0;
  mtx.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&canProduce);
  std::condition_variable::condition_variable(&canConsume);
  this_01 = (producer_threads *)operator_new(0x288);
  threads::producer_threads::producer_threads
            (this_01,target,num_producers,&mtx,&canProduce,&canConsume,this_00);
  this_02 = (consumer_threads *)operator_new(0x288);
  threads::consumer_threads::consumer_threads
            (this_02,target,num_consumers,&mtx,&canConsume,&canProduce,this_00);
  (*(this_01->super_generic_threads)._vptr_generic_threads[3])(this_01);
  (*(this_02->super_generic_threads)._vptr_generic_threads[3])(this_02);
  (*(this_01->super_generic_threads)._vptr_generic_threads[4])(this_01);
  (*(this_02->super_generic_threads)._vptr_generic_threads[4])(this_02);
  bVar1 = (bool)std::__basic_file<char>::is_open();
  this->last_producer_log_status = bVar1;
  (*(this_01->super_generic_threads)._vptr_generic_threads[2])(this_01);
  bVar1 = (bool)std::__basic_file<char>::is_open();
  this->last_consumer_log_status = bVar1;
  (*(this_02->super_generic_threads)._vptr_generic_threads[2])(this_02);
  queue<long>::~queue(this_00);
  operator_delete(this_00,0x28);
  poVar2 = std::operator<<((ostream *)&std::cout,"All threads finished.");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Produced: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"Consumed: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::condition_variable::~condition_variable(&canConsume);
  std::condition_variable::~condition_variable(&canProduce);
  return;
}

Assistant:

void thread_manager::run_threads(std::size_t num_producers, std::size_t num_consumers, std::size_t buffer_capacity, std::size_t target){
	queue<long> *buffer;
	try{
            buffer = new queue<long>(buffer_capacity);
        }
        catch(const std::bad_alloc& e){
	    std::cerr << "Failed to initialize buffer" << std::endl;
	    std::exit(EXIT_FAILURE);
        }
	std::mutex mtx;
	std::condition_variable canProduce, canConsume;
	threads::generic_threads *producers, *consumers;
	try{
	    producers = new threads::producer_threads(target, num_producers, &mtx, &canProduce, &canConsume, buffer);
	}
	catch(const std::bad_alloc& e){
	    std::cerr << "Failed to allocate memory for producer threads." << std::endl;
	    std::exit(EXIT_FAILURE);
	}

	try{
	    consumers = new threads::consumer_threads(target, num_consumers, &mtx, &canConsume, &canProduce, buffer);
	}
	catch(const std::bad_alloc& e){
	    std::cerr << "Failed to allocate memory for consumer threads." << std::endl;
	    std::exit(EXIT_FAILURE);
	}
	
	size_t num_produced, num_consumed;
	try{
	    producers->fork();
	    consumers->fork();
	    num_produced = producers->join();
	    num_consumed = consumers->join();
	}
	catch(const exceptions::thread_failure& e){
	    std::cerr << e.what() << std::endl;
	    std::exit(EXIT_FAILURE);
	}
	
	last_producer_log_status = producers->logfile_is_open();
	delete producers;

	last_consumer_log_status = consumers->logfile_is_open();
	delete consumers;

	delete buffer;

	std::cout << "All threads finished." << std::endl;
	std::cout << "Produced: " << num_produced << std::endl << "Consumed: " << num_consumed << std::endl << std::endl;
    }